

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

int secp256k1_fe_is_square_var(secp256k1_fe *x)

{
  secp256k1_scalar *r;
  secp256k1_fe *r_00;
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  uint32_t uVar3;
  uint32_t uVar4;
  int extraout_EAX_00;
  int extraout_EAX_01;
  secp256k1_gej *psVar5;
  secp256k1_gej *psVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  secp256k1_scalar *a;
  int iVar11;
  secp256k1_ge *b;
  long lVar12;
  uint64_t *t;
  secp256k1_gej *unaff_RBP;
  secp256k1_gej *psVar13;
  secp256k1_fe *psVar14;
  secp256k1_ge *in_RSI;
  secp256k1_ge *psVar15;
  ulong uVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *psVar18;
  uint64_t *puVar19;
  secp256k1_ge *psVar20;
  uint64_t *puVar21;
  secp256k1_gej *psVar22;
  int iVar23;
  secp256k1_gej *unaff_R12;
  secp256k1_gej *psVar24;
  long unaff_R13;
  secp256k1_ge *unaff_R14;
  secp256k1_ge *psVar25;
  secp256k1_gej *unaff_R15;
  bool bVar26;
  byte bVar27;
  secp256k1_fe sqrt;
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 s;
  secp256k1_fe sStack_ff8;
  undefined1 auStack_fc8 [144];
  undefined1 auStack_f38 [112];
  secp256k1_ge sStack_ec8;
  secp256k1_fe asStack_e30 [31];
  secp256k1_ge sStack_848;
  secp256k1_fe asStack_7b0 [31];
  secp256k1_ge *psStack_1c0;
  secp256k1_gej *psStack_1b8;
  long lStack_1b0;
  secp256k1_ge *psStack_1a8;
  secp256k1_gej *psStack_1a0;
  secp256k1_gej *psStack_198;
  undefined8 uStack_188;
  ulong uStack_180;
  ulong uStack_178;
  secp256k1_ge *psStack_170;
  secp256k1_gej *psStack_168;
  ulong uStack_160;
  secp256k1_ge *psStack_158;
  ulong uStack_150;
  secp256k1_ge *psStack_148;
  uint64_t uStack_140;
  uint64_t auStack_138 [4];
  secp256k1_modinv64_trans2x2 sStack_118;
  secp256k1_ge *psStack_f8;
  undefined1 local_c8 [56];
  ulong uStack_90;
  ulong local_88;
  uint64_t uStack_80;
  uint64_t local_78;
  int iStack_70;
  int iStack_6c;
  secp256k1_modinv64_signed62 local_68;
  secp256k1_fe local_40;
  
  bVar27 = 0;
  psVar17 = (secp256k1_gej *)local_c8;
  psVar24 = (secp256k1_gej *)local_c8;
  b = (secp256k1_ge *)local_c8;
  local_c8._48_8_ = x->n[0];
  uStack_90 = x->n[1];
  local_88 = x->n[2];
  uStack_80 = x->n[3];
  local_78 = x->n[4];
  iStack_70 = x->magnitude;
  iStack_6c = x->normalized;
  secp256k1_fe_verify(x);
  local_c8._0_8_ = x->n[0];
  local_c8._8_8_ = x->n[1];
  local_c8._16_8_ = x->n[2];
  local_c8._24_8_ = x->n[3];
  local_c8._32_8_ = x->n[4];
  local_c8._40_4_ = x->magnitude;
  local_c8._44_4_ = x->normalized;
  secp256k1_fe_normalize_var((secp256k1_fe *)local_c8);
  secp256k1_fe_verify((secp256k1_fe *)local_c8);
  if (local_c8._44_4_ == 0) {
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((local_c8._16_8_ == 0 && local_c8._24_8_ == 0) &&
        (local_c8._8_8_ == 0 && local_c8._0_8_ == 0)) && local_c8._32_8_ == 0) {
      b = (secp256k1_ge *)0x1;
    }
    else {
      local_68.v[0] = (local_c8._8_8_ << 0x34 | local_c8._0_8_) & 0x3fffffffffffffff;
      local_68.v[1] = (ulong)((uint)local_c8._16_8_ & 0xfffff) << 0x2a | (ulong)local_c8._8_8_ >> 10
      ;
      local_68.v[2] =
           (ulong)((uint)local_c8._24_8_ & 0x3fffffff) << 0x20 | (ulong)local_c8._16_8_ >> 0x14;
      local_68.v[3] = (local_c8._32_8_ & 0xffffffffff) << 0x16 | (ulong)local_c8._24_8_ >> 0x1e;
      local_68.v[4] = (ulong)local_c8._32_8_ >> 0x28;
      uVar1 = secp256k1_jacobi64_maybe_var(&local_68,&secp256k1_const_modinfo_fe);
      if (uVar1 == 0) {
        uVar1 = secp256k1_fe_sqrt(&local_40,(secp256k1_fe *)local_c8);
        b = (secp256k1_ge *)(ulong)uVar1;
      }
      else {
        b = (secp256k1_ge *)(ulong)(~uVar1 >> 0x1f);
      }
    }
    unaff_R14 = (secp256k1_ge *)(local_c8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    local_c8._48_8_ = (local_78 >> 0x30) * 0x1000003d1 + local_c8._48_8_;
    uStack_90 = ((ulong)local_c8._48_8_ >> 0x34) + uStack_90;
    local_88 = (uStack_90 >> 0x34) + local_88;
    uVar16 = (local_88 >> 0x34) + uStack_80;
    uStack_80 = uVar16 & 0xfffffffffffff;
    local_78 = (uVar16 >> 0x34) + (local_78 & 0xffffffffffff);
    local_88 = local_88 & 0xfffffffffffff;
    uStack_90 = uStack_90 & 0xfffffffffffff;
    local_c8._48_8_ = local_c8._48_8_ & 0xfffffffffffff;
    iStack_70 = 1;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R14);
    in_RSI = unaff_R14;
    iVar2 = secp256k1_fe_sqrt((secp256k1_fe *)local_c8,(secp256k1_fe *)unaff_R14);
    psVar17 = psVar24;
    if ((int)b == iVar2) {
      return (int)b;
    }
  }
  secp256k1_fe_is_square_var_cold_1();
  psStack_f8 = b;
  auStack_138[3] = (in_RSI->x).n[4];
  auStack_138[1] = (in_RSI->x).n[2];
  auStack_138[2] = (in_RSI->x).n[3];
  uStack_140 = (in_RSI->x).n[0];
  auStack_138[0] = (in_RSI->x).n[1];
  uStack_180 = (psVar17->x).n[0];
  uStack_178 = (psVar17->x).n[1];
  psStack_170 = (secp256k1_ge *)(psVar17->x).n[2];
  psStack_168 = (secp256k1_gej *)(psVar17->x).n[3];
  uStack_160 = (psVar17->x).n[4];
  psVar15 = in_RSI;
  if (((((long)uStack_180 < 0) || ((long)uStack_178 < 0)) ||
      (b = in_RSI, psVar15 = psStack_170, (long)psStack_170 < 0)) ||
     ((psVar17 = psStack_168, (long)psStack_168 < 0 || ((long)uStack_160 < 0)))) {
LAB_00149fe3:
    psStack_198 = (secp256k1_gej *)0x149fe8;
    secp256k1_jacobi64_maybe_var_cold_18();
LAB_00149fe8:
    psStack_198 = (secp256k1_gej *)0x149fed;
    secp256k1_jacobi64_maybe_var_cold_11();
LAB_00149fed:
    psStack_198 = (secp256k1_gej *)0x149ff2;
    secp256k1_jacobi64_maybe_var_cold_10();
LAB_00149ff2:
    psStack_198 = (secp256k1_gej *)0x149ff7;
    secp256k1_jacobi64_maybe_var_cold_9();
LAB_00149ff7:
    psStack_198 = (secp256k1_gej *)0x149ffc;
    secp256k1_jacobi64_maybe_var_cold_8();
    in_RSI = b;
    psVar24 = unaff_R12;
    psVar25 = unaff_R14;
  }
  else {
    psVar15 = (secp256k1_ge *)
              ((ulong)psStack_170 | (ulong)psStack_168 | uStack_178 | uStack_180 | uStack_160);
    psVar24 = unaff_R12;
    psVar25 = unaff_R14;
    if (psVar15 != (secp256k1_ge *)0x0) {
      unaff_R14 = (secp256k1_ge *)0x5;
      unaff_R13 = -1;
      uStack_150 = 0;
      unaff_RBP = (secp256k1_gej *)0x0;
      psStack_158 = in_RSI;
      do {
        b = psStack_158;
        psVar17 = (secp256k1_gej *)(auStack_138[0] << 0x3e | uStack_140);
        puVar19 = (uint64_t *)(uStack_178 << 0x3e | uStack_180);
        psVar5 = (secp256k1_gej *)0x0;
        psVar20 = (secp256k1_ge *)0x0;
        psVar24 = (secp256k1_gej *)0x1;
        iVar2 = 0x3e;
        psVar25 = (secp256k1_ge *)0x1;
        puVar21 = puVar19;
        psVar18 = psVar17;
        while( true ) {
          uVar16 = -1L << ((byte)iVar2 & 0x3f) | (ulong)puVar21;
          lVar12 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          bVar7 = (byte)lVar12;
          psVar22 = (secp256k1_gej *)((ulong)puVar21 >> (bVar7 & 0x3f));
          psVar25 = (secp256k1_ge *)((long)psVar25 << (bVar7 & 0x3f));
          psVar5 = (secp256k1_gej *)((long)psVar5 << (bVar7 & 0x3f));
          unaff_R13 = unaff_R13 - lVar12;
          psVar15 = (secp256k1_ge *)((ulong)psVar18 >> 2);
          uVar1 = ((uint)((ulong)psVar18 >> 1) ^ (uint)psVar15) & (uint)lVar12 ^ (uint)unaff_RBP;
          unaff_R15 = (secp256k1_gej *)(ulong)uVar1;
          iVar2 = iVar2 - (uint)lVar12;
          psStack_148 = unaff_R14;
          if (iVar2 == 0) break;
          if (((ulong)psVar18 & 1) == 0) {
            psStack_198 = (secp256k1_gej *)0x149fb1;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00149fb1:
            psStack_198 = (secp256k1_gej *)0x149fb6;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_00149fb6:
            psStack_198 = (secp256k1_gej *)0x149fbb;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_00149fbb:
            psStack_198 = (secp256k1_gej *)0x149fc0;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00149fc0;
          }
          if (((ulong)psVar22 & 1) == 0) goto LAB_00149fb1;
          psVar15 = (secp256k1_ge *)((long)psVar5 * (long)puVar19 + (long)psVar25 * (long)psVar17);
          bVar7 = 0x3e - (char)iVar2;
          in_RSI = (secp256k1_ge *)((long)psVar18 << (bVar7 & 0x3f));
          if (psVar15 != in_RSI) goto LAB_00149fb6;
          in_RSI = (secp256k1_ge *)((long)psVar24 * (long)puVar19 + (long)psVar20 * (long)psVar17);
          psVar15 = (secp256k1_ge *)((long)psVar22 << (bVar7 & 0x3f));
          if (in_RSI != psVar15) goto LAB_00149fbb;
          iVar23 = (int)psVar18;
          iVar11 = (int)psVar22;
          if (unaff_R13 < 0) {
            unaff_R13 = -unaff_R13;
            iVar8 = (int)unaff_R13 + 1;
            if (iVar2 <= iVar8) {
              iVar8 = iVar2;
            }
            psVar15 = (secp256k1_ge *)(ulong)(iVar8 - 0x3fU);
            if (0xffffffc1 < iVar8 - 0x3fU) {
              unaff_RBP = (secp256k1_gej *)
                          (ulong)(uVar1 ^ (uint)(((ulong)psVar22 & (ulong)psVar18) >> 1));
              in_RSI = (secp256k1_ge *)
                       ((ulong)(0x3fL << (-(char)iVar8 & 0x3fU)) >> (-(char)iVar8 & 0x3fU));
              uVar1 = (iVar11 * iVar11 + 0x3e) * iVar11 * iVar23 & (uint)in_RSI;
              psVar6 = psVar5;
              psVar5 = psVar24;
              psVar13 = psVar22;
              psVar15 = psVar25;
              psVar25 = psVar20;
              goto LAB_00149d9b;
            }
            goto LAB_00149fca;
          }
          iVar8 = (int)unaff_R13 + 1;
          if (iVar2 <= iVar8) {
            iVar8 = iVar2;
          }
          psVar15 = (secp256k1_ge *)(ulong)(iVar8 - 0x3fU);
          if (iVar8 - 0x3fU < 0xffffffc2) goto LAB_00149fc5;
          in_RSI = (secp256k1_ge *)
                   ((ulong)(0xfL << (-(char)iVar8 & 0x3fU)) >> (-(char)iVar8 & 0x3fU));
          uVar1 = -(iVar11 * ((iVar23 * 2 + 2U & 8) + iVar23)) & (uint)in_RSI;
          psVar6 = psVar24;
          psVar13 = psVar18;
          psVar15 = psVar20;
          psVar18 = psVar22;
          unaff_RBP = unaff_R15;
LAB_00149d9b:
          uVar16 = (ulong)uVar1;
          puVar21 = (uint64_t *)((long)(psVar18->x).n + uVar16 * (long)psVar13);
          psVar20 = (secp256k1_ge *)((long)(psVar15->x).n + (long)psVar25 * uVar16);
          psVar24 = (secp256k1_gej *)((long)(psVar6->x).n + uVar16 * (long)psVar5);
          psVar18 = psVar13;
          unaff_R15 = unaff_RBP;
          if (((ulong)puVar21 & (ulong)in_RSI) != 0) {
LAB_00149fc0:
            psStack_198 = (secp256k1_gej *)0x149fc5;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00149fc5:
            psStack_198 = (secp256k1_gej *)0x149fca;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_00149fca:
            psStack_198 = (secp256k1_gej *)0x149fcf;
            secp256k1_jacobi64_maybe_var_cold_5();
            b = in_RSI;
            unaff_R12 = psVar24;
            unaff_R14 = psVar25;
            goto LAB_00149fcf;
          }
        }
        psVar17 = SUB168(SEXT816((long)psVar5) * SEXT816((long)psVar20),8);
        uVar16 = (long)psVar25 * (long)psVar24 - (long)psVar5 * (long)psVar20;
        uVar10 = (SUB168(SEXT816((long)psVar25) * SEXT816((long)psVar24),8) - (long)psVar17) -
                 (ulong)((ulong)((long)psVar25 * (long)psVar24) <
                        (ulong)((long)psVar5 * (long)psVar20));
        psVar15 = (secp256k1_ge *)(~uVar10 | uVar16 ^ 0xc000000000000000);
        unaff_RBP = (secp256k1_gej *)&uStack_180;
        sStack_118.u = (int64_t)psVar25;
        sStack_118.v = (int64_t)psVar5;
        sStack_118.q = (int64_t)psVar20;
        sStack_118.r = (int64_t)psVar24;
        if ((psVar15 != (secp256k1_ge *)0x0) && (uVar16 != 0x4000000000000000 || uVar10 != 0))
        goto LAB_0014a001;
        unaff_R12 = (secp256k1_gej *)&uStack_140;
        iVar11 = (int)unaff_R14;
        psStack_198 = (secp256k1_gej *)0x149e49;
        psVar15 = unaff_R14;
        psVar17 = unaff_R12;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R12,iVar11,
                           (secp256k1_modinv64_signed62 *)psStack_158,0);
        if (iVar2 < 1) {
LAB_00149fcf:
          psStack_198 = (secp256k1_gej *)0x149fd4;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00149fd4:
          psStack_198 = (secp256k1_gej *)0x149fd9;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_00149fd9:
          psStack_198 = (secp256k1_gej *)0x149fde;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00149fde:
          psStack_198 = (secp256k1_gej *)0x149fe3;
          secp256k1_jacobi64_maybe_var_cold_12();
          goto LAB_00149fe3;
        }
        psStack_198 = (secp256k1_gej *)0x149e64;
        psVar15 = unaff_R14;
        psVar17 = unaff_R12;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_R12,iVar11,
                           (secp256k1_modinv64_signed62 *)b,1);
        if (0 < iVar2) goto LAB_00149fd4;
        psStack_198 = (secp256k1_gej *)0x149e7c;
        psVar15 = unaff_R14;
        psVar17 = unaff_RBP;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar11,
                           (secp256k1_modinv64_signed62 *)b,0);
        if (iVar2 < 1) goto LAB_00149fd9;
        psStack_198 = (secp256k1_gej *)0x149e97;
        psVar15 = unaff_R14;
        psVar17 = unaff_RBP;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar11,
                           (secp256k1_modinv64_signed62 *)b,1);
        if (-1 < iVar2) goto LAB_00149fde;
        psStack_198 = (secp256k1_gej *)0x149eb2;
        secp256k1_modinv64_update_fg_62_var
                  (iVar11,(secp256k1_modinv64_signed62 *)unaff_R12,
                   (secp256k1_modinv64_signed62 *)unaff_RBP,&sStack_118);
        if (uStack_140 == 1) {
          if (1 < iVar11) {
            psVar15 = (secp256k1_ge *)0x1;
            uVar16 = 0;
            do {
              uVar16 = uVar16 | auStack_138[(long)&psVar15[-1].field_0x67];
              psVar15 = (secp256k1_ge *)((long)(psVar15->x).n + 1);
            } while (unaff_R14 != psVar15);
            if (uVar16 != 0) goto LAB_00149ee4;
          }
          uStack_188._4_4_ = 1 - (uVar1 * 2 & 2);
          bVar26 = false;
        }
        else {
LAB_00149ee4:
          lVar12 = (long)iVar11;
          if ((-1 < lVar12 + -2 && (&psStack_148)[lVar12] == (secp256k1_ge *)0x0) &&
              (&uStack_188)[lVar12] == 0) {
            unaff_R14 = (secp256k1_ge *)(ulong)(iVar11 - 1);
          }
          psStack_198 = (secp256k1_gej *)0x149f11;
          iVar11 = (int)unaff_R14;
          psVar15 = unaff_R14;
          psVar17 = unaff_R12;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar11,
                             (secp256k1_modinv64_signed62 *)b,0);
          if (iVar2 < 1) goto LAB_00149fe8;
          psStack_198 = (secp256k1_gej *)0x149f2c;
          psVar15 = unaff_R14;
          psVar17 = unaff_R12;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_R12,iVar11,
                             (secp256k1_modinv64_signed62 *)b,1);
          if (0 < iVar2) goto LAB_00149fed;
          psStack_198 = (secp256k1_gej *)0x149f44;
          psVar15 = unaff_R14;
          psVar17 = unaff_RBP;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar11,
                             (secp256k1_modinv64_signed62 *)b,0);
          if (iVar2 < 1) goto LAB_00149ff2;
          psStack_198 = (secp256k1_gej *)0x149f5f;
          psVar15 = unaff_R14;
          psVar17 = unaff_RBP;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)unaff_RBP,iVar11,
                             (secp256k1_modinv64_signed62 *)b,1);
          bVar26 = true;
          if (-1 < iVar2) goto LAB_00149ff7;
        }
        if (!bVar26) {
          return uStack_188._4_4_;
        }
        uVar1 = (int)uStack_150 + 1;
        uStack_150 = (ulong)uVar1;
        in_RSI = b;
        unaff_RBP = unaff_R15;
        if (uVar1 == 0xc) {
          return 0;
        }
      } while( true );
    }
  }
  psStack_198 = (secp256k1_gej *)0x14a001;
  secp256k1_jacobi64_maybe_var_cold_17();
LAB_0014a001:
  psStack_198 = (secp256k1_gej *)secp256k1_ecmult_const;
  secp256k1_jacobi64_maybe_var_cold_16();
  psStack_1c0 = in_RSI;
  psStack_1b8 = psVar24;
  lStack_1b0 = unaff_R13;
  psStack_1a8 = psVar25;
  psStack_1a0 = unaff_R15;
  psStack_198 = unaff_RBP;
  secp256k1_ge_verify(psVar15);
  if (psVar15->infinity != 0) {
    secp256k1_gej_set_infinity(psVar17);
    return extraout_EAX;
  }
  r = (secp256k1_scalar *)(auStack_f38 + 0x50);
  secp256k1_scalar_add(r,a,&secp256k1_ecmult_const_K);
  secp256k1_scalar_half(r,r);
  psVar24 = (secp256k1_gej *)(auStack_fc8 + 0x70);
  secp256k1_scalar_split_lambda((secp256k1_scalar *)auStack_f38,(secp256k1_scalar *)psVar24,r);
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_f38,(secp256k1_scalar *)auStack_f38,
             &secp256k1_ecmult_const::S_OFFSET);
  psVar5 = psVar24;
  secp256k1_scalar_add
            ((secp256k1_scalar *)psVar24,(secp256k1_scalar *)psVar24,
             &secp256k1_ecmult_const::S_OFFSET);
  uVar16 = 0x81;
  do {
    psVar18 = (secp256k1_gej *)auStack_f38;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_f38);
    if ((*(ulong *)(auStack_f38 + (uVar16 >> 6) * 8) >> (uVar16 & 0x3f) & 1) != 0) {
      secp256k1_ecmult_const_cold_1();
LAB_0014a4d3:
      secp256k1_ecmult_const_cold_2();
      goto LAB_0014a4d8;
    }
    psVar18 = psVar24;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar24);
    if ((*(ulong *)(auStack_f38 + (uVar16 >> 6) * 8 + -0x20) >> ((uint)uVar16 & 0x3f) & 1) != 0)
    goto LAB_0014a4d3;
    uVar1 = (uint)uVar16 + 1;
    uVar16 = (ulong)uVar1;
  } while (uVar1 != 0x100);
  secp256k1_gej_set_ge(psVar17,psVar15);
  secp256k1_ecmult_odd_multiples_table
            (0x10,&sStack_848,&sStack_ec8.x,(secp256k1_fe *)(auStack_f38 + 0x20),psVar17);
  secp256k1_ge_table_set_globalz(0x10,&sStack_848,&sStack_ec8.x);
  lVar12 = 0;
  do {
    secp256k1_ge_mul_lambda
              ((secp256k1_ge *)((long)sStack_ec8.x.n + lVar12),
               (secp256k1_ge *)((long)sStack_848.x.n + lVar12));
    lVar12 = lVar12 + 0x68;
  } while (lVar12 != 0x680);
  r_00 = (secp256k1_fe *)(auStack_fc8 + 0x30);
  iVar2 = 0x19;
  while( true ) {
    uVar1 = iVar2 * 5;
    uVar3 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)auStack_f38,uVar1,5);
    psVar18 = (secp256k1_gej *)(auStack_fc8 + 0x70);
    psVar5 = (secp256k1_gej *)(ulong)uVar1;
    uVar4 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psVar18,uVar1,5);
    uVar1 = uVar3 >> 4 ^ 1;
    if (0x1f < uVar3) break;
    auStack_fc8._32_8_ = sStack_848.x.n[4];
    auStack_fc8._40_4_ = sStack_848.x.magnitude;
    auStack_fc8._44_4_ = sStack_848.x.normalized;
    auStack_fc8._16_8_ = sStack_848.x.n[2];
    auStack_fc8._24_8_ = sStack_848.x.n[3];
    auStack_fc8._0_8_ = sStack_848.x.n[0];
    auStack_fc8._8_8_ = sStack_848.x.n[1];
    auStack_fc8._80_8_ = sStack_848.y.n[4];
    auStack_fc8._88_4_ = sStack_848.y.magnitude;
    auStack_fc8._92_4_ = sStack_848.y.normalized;
    auStack_fc8._64_8_ = sStack_848.y.n[2];
    auStack_fc8._72_8_ = sStack_848.y.n[3];
    auStack_fc8._48_8_ = sStack_848.y.n[0];
    auStack_fc8._56_8_ = sStack_848.y.n[1];
    uVar16 = 1;
    psVar14 = asStack_7b0;
    do {
      uVar9 = (uint)(((uVar3 ^ -uVar1) & 0xf) == uVar16);
      secp256k1_fe_cmov((secp256k1_fe *)auStack_fc8,psVar14 + -1,uVar9);
      secp256k1_fe_cmov(r_00,psVar14,uVar9);
      uVar16 = uVar16 + 1;
      psVar14 = (secp256k1_fe *)(psVar14[2].n + 1);
    } while (uVar16 != 0x10);
    auStack_fc8._96_4_ = 0;
    secp256k1_fe_verify(r_00);
    secp256k1_fe_verify_magnitude(r_00,1);
    sStack_ff8.n[0] = 0x3ffffbfffff0bc - auStack_fc8._48_8_;
    sStack_ff8.n[1] = 0x3ffffffffffffc - auStack_fc8._56_8_;
    sStack_ff8.n[2] = 0x3ffffffffffffc - auStack_fc8._64_8_;
    sStack_ff8.n[3] = 0x3ffffffffffffc - auStack_fc8._72_8_;
    sStack_ff8.n[4] = 0x3fffffffffffc - auStack_fc8._80_8_;
    sStack_ff8.magnitude = 2;
    sStack_ff8.normalized = 0;
    secp256k1_fe_verify(&sStack_ff8);
    secp256k1_fe_cmov(r_00,&sStack_ff8,uVar1);
    psVar18 = psVar17;
    if (iVar2 == 0x19) {
      psVar5 = (secp256k1_gej *)auStack_fc8;
      secp256k1_gej_set_ge(psVar17,(secp256k1_ge *)auStack_fc8);
    }
    else {
      iVar11 = 5;
      do {
        secp256k1_gej_double(psVar17,psVar17);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      psVar5 = psVar17;
      secp256k1_gej_add_ge(psVar17,psVar17,(secp256k1_ge *)auStack_fc8);
    }
    uVar1 = uVar4 >> 4 ^ 1;
    if (0x1f < uVar4) goto LAB_0014a4dd;
    auStack_fc8._32_8_ = sStack_ec8.x.n[4];
    auStack_fc8._40_4_ = sStack_ec8.x.magnitude;
    auStack_fc8._44_4_ = sStack_ec8.x.normalized;
    auStack_fc8._16_8_ = sStack_ec8.x.n[2];
    auStack_fc8._24_8_ = sStack_ec8.x.n[3];
    auStack_fc8._0_8_ = sStack_ec8.x.n[0];
    auStack_fc8._8_8_ = sStack_ec8.x.n[1];
    auStack_fc8._80_8_ = sStack_ec8.y.n[4];
    auStack_fc8._88_4_ = sStack_ec8.y.magnitude;
    auStack_fc8._92_4_ = sStack_ec8.y.normalized;
    auStack_fc8._64_8_ = sStack_ec8.y.n[2];
    auStack_fc8._72_8_ = sStack_ec8.y.n[3];
    auStack_fc8._48_8_ = sStack_ec8.y.n[0];
    auStack_fc8._56_8_ = sStack_ec8.y.n[1];
    uVar16 = 1;
    psVar14 = asStack_e30;
    do {
      uVar9 = (uint)(((uVar4 ^ -uVar1) & 0xf) == uVar16);
      secp256k1_fe_cmov((secp256k1_fe *)auStack_fc8,psVar14 + -1,uVar9);
      secp256k1_fe_cmov(r_00,psVar14,uVar9);
      uVar16 = uVar16 + 1;
      psVar14 = (secp256k1_fe *)(psVar14[2].n + 1);
    } while (uVar16 != 0x10);
    auStack_fc8._96_4_ = 0;
    secp256k1_fe_verify(r_00);
    secp256k1_fe_verify_magnitude(r_00,1);
    sStack_ff8.n[0] = 0x3ffffbfffff0bc - auStack_fc8._48_8_;
    sStack_ff8.n[1] = 0x3ffffffffffffc - auStack_fc8._56_8_;
    sStack_ff8.n[2] = 0x3ffffffffffffc - auStack_fc8._64_8_;
    sStack_ff8.n[3] = 0x3ffffffffffffc - auStack_fc8._72_8_;
    sStack_ff8.n[4] = 0x3fffffffffffc - auStack_fc8._80_8_;
    sStack_ff8.magnitude = 2;
    sStack_ff8.normalized = 0;
    secp256k1_fe_verify(&sStack_ff8);
    secp256k1_fe_cmov(r_00,&sStack_ff8,uVar1);
    secp256k1_gej_add_ge(psVar17,psVar17,(secp256k1_ge *)auStack_fc8);
    bVar26 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar26) {
      secp256k1_fe_mul(&psVar17->z,&psVar17->z,(secp256k1_fe *)(auStack_f38 + 0x20));
      return extraout_EAX_00;
    }
  }
LAB_0014a4d8:
  secp256k1_ecmult_const_cold_4();
LAB_0014a4dd:
  secp256k1_ecmult_const_cold_3();
  secp256k1_ge_verify((secp256k1_ge *)psVar5);
  psVar17 = psVar18;
  for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
    (psVar17->x).n[0] = (psVar5->x).n[0];
    psVar5 = (secp256k1_gej *)((long)psVar5 + (ulong)bVar27 * -0x10 + 8);
    psVar17 = (secp256k1_gej *)((long)psVar17 + (ulong)bVar27 * -0x10 + 8);
  }
  secp256k1_fe_mul(&psVar18->x,&psVar18->x,&secp256k1_const_beta);
  secp256k1_ge_verify((secp256k1_ge *)psVar18);
  return extraout_EAX_01;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_is_square_var(const secp256k1_fe *x) {
    int ret;
    secp256k1_fe tmp = *x, sqrt;
    SECP256K1_FE_VERIFY(x);

    ret = secp256k1_fe_impl_is_square_var(x);
    secp256k1_fe_normalize_weak(&tmp);
    VERIFY_CHECK(ret == secp256k1_fe_sqrt(&sqrt, &tmp));
    return ret;
}